

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::dumpInteger(Dumper *this,Slice slice)

{
  ValueType VVar1;
  uint64_t v;
  int64_t iVar2;
  Slice slice_local;
  
  VVar1 = SliceStaticData::TypeMap[*slice._start];
  slice_local = slice;
  if (VVar1 == Int) {
    iVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getIntUnchecked
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    appendInt(this,iVar2);
  }
  else if (VVar1 == SmallInt) {
    iVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
            getSmallIntUnchecked
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    if (iVar2 < 0) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
      iVar2 = -iVar2;
    }
    (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(uint)(int)(char)((char)iVar2 + '0'));
  }
  else if (VVar1 == UInt) {
    v = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUIntUnchecked
                  ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                   &slice_local);
    appendUInt(this,v);
  }
  return;
}

Assistant:

void Dumper::dumpInteger(Slice slice) {
  VELOCYPACK_ASSERT(slice.isInteger());

  if (slice.isType(ValueType::UInt)) {
    uint64_t v = slice.getUIntUnchecked();

    appendUInt(v);
  } else if (slice.isType(ValueType::Int)) {
    int64_t v = slice.getIntUnchecked();

    appendInt(v);
  } else if (slice.isType(ValueType::SmallInt)) {
    int64_t v = slice.getSmallIntUnchecked();
    if (v < 0) {
      _sink->push_back('-');
      v = -v;
    }
    _sink->push_back('0' + static_cast<char>(v));
  }
}